

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall
cmTarget::AddSources
          (cmTarget *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *srcs)

{
  pointer *pppTVar1;
  pointer pcVar2;
  cmTargetInternals *pcVar3;
  iterator __position;
  bool bVar4;
  cmGeneratorExpression cVar5;
  pointer pbVar6;
  cmCompiledGeneratorExpression *x;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  string srcFiles;
  string filename;
  cmGeneratorExpression ge;
  cmGeneratorExpression local_b8;
  auto_ptr<cmCompiledGeneratorExpression> local_b0;
  auto_ptr<cmCompiledGeneratorExpression> local_a8;
  undefined1 *local_a0;
  long local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  undefined1 local_80 [48];
  string local_50;
  
  local_a0 = &local_90;
  local_98 = 0;
  local_90 = 0;
  pbVar6 = (srcs->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar6 != (srcs->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pcVar2 = (pbVar6->_M_dataplus)._M_p;
      local_80._0_8_ = local_80 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_80,pcVar2,pcVar2 + pbVar6->_M_string_length);
      if ((*(char *)local_80._0_8_ == '$') && (*(char *)(local_80._0_8_ + 1) == '<')) {
LAB_00307f1c:
        std::__cxx11::string::append((char *)&local_a0);
        bVar4 = true;
        std::__cxx11::string::_M_append((char *)&local_a0,local_80._0_8_);
      }
      else {
        if ((pointer)local_80._8_8_ == (pointer)0x0) {
LAB_00307f06:
          cmMakefile::GetOrCreateSource(this->Makefile,(string *)local_80,false);
          goto LAB_00307f1c;
        }
        ProcessSourceItemCMP0049(&local_50,this,(string *)local_80);
        std::__cxx11::string::operator=((string *)local_80,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_80._8_8_ != (pointer)0x0) goto LAB_00307f06;
        bVar4 = false;
      }
      if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
        operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
      }
      if (!bVar4) goto LAB_00308088;
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != (srcs->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
    if (local_98 != 0) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
      ::clear(&(((this->Internal).Pointer)->SourceFilesMap)._M_t);
      this->LinkImplementationLanguageIsContextDependent = true;
      cmMakefile::GetBacktrace((cmListFileBacktrace *)local_80,this->Makefile);
      cmGeneratorExpression::cmGeneratorExpression
                ((cmGeneratorExpression *)&local_50,(cmListFileBacktrace *)local_80);
      cmGeneratorExpression::Parse(&local_b8,&local_50);
      cVar5.Backtrace = local_b8.Backtrace;
      local_b8.Backtrace = (cmListFileBacktrace *)0x0;
      local_b0.x_ = (cmCompiledGeneratorExpression *)cVar5.Backtrace;
      cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                ((auto_ptr<cmCompiledGeneratorExpression> *)&local_b8);
      *(undefined1 *)
       &cVar5.Backtrace[8].super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
        super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
        super__Vector_impl_data._M_finish = 1;
      pcVar3 = (this->Internal).Pointer;
      local_b8.Backtrace = (cmListFileBacktrace *)operator_new(0x10);
      local_b0.x_ = (cmCompiledGeneratorExpression *)0x0;
      local_a8.x_ = (cmCompiledGeneratorExpression *)0x0;
      (((cmCompiledGeneratorExpression *)local_b8.Backtrace)->Backtrace).
      super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
      super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)cVar5.Backtrace;
      (((cmCompiledGeneratorExpression *)local_b8.Backtrace)->Backtrace).
      super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
      super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)&cmTargetInternals::TargetPropertyEntry::NoLinkImplItem;
      __position._M_current =
           (pcVar3->SourceEntries).
           super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pcVar3->SourceEntries).
          super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
        ::_M_realloc_insert<cmTargetInternals::TargetPropertyEntry*>
                  ((vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
                    *)&pcVar3->SourceEntries,__position,(TargetPropertyEntry **)&local_b8);
      }
      else {
        *__position._M_current = (TargetPropertyEntry *)local_b8.Backtrace;
        pppTVar1 = &(pcVar3->SourceEntries).
                    super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar1 = *pppTVar1 + 1;
      }
      cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_a8);
      cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_b0);
      cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&local_50);
      std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
                ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)local_80);
    }
  }
LAB_00308088:
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  return;
}

Assistant:

void cmTarget::AddSources(std::vector<std::string> const& srcs)
{
  std::string srcFiles;
  const char* sep = "";
  for(std::vector<std::string>::const_iterator i = srcs.begin();
      i != srcs.end(); ++i)
    {
    std::string filename = *i;
    const char* src = filename.c_str();

    if(!(src[0] == '$' && src[1] == '<'))
      {
      if(!filename.empty())
        {
        filename = this->ProcessSourceItemCMP0049(filename);
        if(filename.empty())
          {
          return;
          }
        }
      this->Makefile->GetOrCreateSource(filename);
      }
    srcFiles += sep;
    srcFiles += filename;
    sep = ";";
    }
  if (!srcFiles.empty())
    {
    this->Internal->SourceFilesMap.clear();
    this->LinkImplementationLanguageIsContextDependent = true;
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmGeneratorExpression ge(&lfbt);
    cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(srcFiles);
    cge->SetEvaluateForBuildsystem(true);
    this->Internal->SourceEntries.push_back(
                          new cmTargetInternals::TargetPropertyEntry(cge));
    }
}